

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

void * ON_SubD__Allocate(size_t sz)

{
  void *pvVar1;
  
  if (sz != 0) {
    pvVar1 = operator_new__(sz * 8 + 0x38 & 0xffffffffffffffc0,(nothrow_t *)&std::nothrow);
    if (pvVar1 == (void *)0x0) {
      ON_SubDIncrementErrorCount();
      pvVar1 = (void *)0x0;
    }
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

static void* ON_SubD__Allocate(size_t sz)
{
  if (0 == sz)
    return nullptr;

  // double array allocation is used to insure the memory
  // returned by new is properly aligned for any type.
  double* a;
  size_t sz1 = sz % sizeof(a[0]);
  if (sz1 > 0)
    sz += (sizeof(a[0]) - sz1);
  a = new(std::nothrow) double[sz];

  if (nullptr == a)
    return ON_SUBD_RETURN_ERROR(nullptr);

  return a;
}